

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_mutex * pthreadMutexAlloc(int iType)

{
  pthread_mutex_t *ppVar1;
  pthread_mutexattr_t recursiveAttr;
  pthread_mutexattr_t local_14;
  
  if (iType == 0) {
    ppVar1 = (pthread_mutex_t *)sqlite3Malloc(0x28);
    if (ppVar1 != (pthread_mutex_t *)0x0) {
      *(int *)((long)ppVar1 + 0x10) = 0;
      *(int *)((long)ppVar1 + 0x14) = 0;
      (ppVar1->__data).__list.__prev = (__pthread_internal_list *)0x0;
      ppVar1->__align = 0;
      *(int *)((long)ppVar1 + 8) = 0;
      *(uint *)((long)ppVar1 + 0xc) = 0;
      (ppVar1->__data).__list.__next = (__pthread_internal_list *)0x0;
      pthread_mutex_init(ppVar1,(pthread_mutexattr_t *)0x0);
      return (sqlite3_mutex *)ppVar1;
    }
  }
  else {
    if (iType != 1) {
      return pthreadMutexAlloc::staticMutexes + (iType + -2);
    }
    ppVar1 = (pthread_mutex_t *)sqlite3Malloc(0x28);
    if (ppVar1 != (pthread_mutex_t *)0x0) {
      *(int *)((long)ppVar1 + 0x10) = 0;
      *(int *)((long)ppVar1 + 0x14) = 0;
      (ppVar1->__data).__list.__prev = (__pthread_internal_list *)0x0;
      ppVar1->__align = 0;
      *(int *)((long)ppVar1 + 8) = 0;
      *(uint *)((long)ppVar1 + 0xc) = 0;
      (ppVar1->__data).__list.__next = (__pthread_internal_list *)0x0;
      pthread_mutexattr_init(&local_14);
      pthread_mutexattr_settype(&local_14,1);
      pthread_mutex_init(ppVar1,&local_14);
      pthread_mutexattr_destroy(&local_14);
      return (sqlite3_mutex *)ppVar1;
    }
  }
  return (sqlite3_mutex *)0x0;
}

Assistant:

static sqlite3_mutex *pthreadMutexAlloc(int iType){
  static sqlite3_mutex staticMutexes[] = {
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER,
    SQLITE3_MUTEX_INITIALIZER
  };
  sqlite3_mutex *p;
  switch( iType ){
    case SQLITE_MUTEX_RECURSIVE: {
      p = sqlite3MallocZero( sizeof(*p) );
      if( p ){
#ifdef SQLITE_HOMEGROWN_RECURSIVE_MUTEX
        /* If recursive mutexes are not available, we will have to
        ** build our own.  See below. */
        pthread_mutex_init(&p->mutex, 0);
#else
        /* Use a recursive mutex if it is available */
        pthread_mutexattr_t recursiveAttr;
        pthread_mutexattr_init(&recursiveAttr);
        pthread_mutexattr_settype(&recursiveAttr, PTHREAD_MUTEX_RECURSIVE);
        pthread_mutex_init(&p->mutex, &recursiveAttr);
        pthread_mutexattr_destroy(&recursiveAttr);
#endif
#if SQLITE_MUTEX_NREF
        p->id = iType;
#endif
      }
      break;
    }
    case SQLITE_MUTEX_FAST: {
      p = sqlite3MallocZero( sizeof(*p) );
      if( p ){
#if SQLITE_MUTEX_NREF
        p->id = iType;
#endif
        pthread_mutex_init(&p->mutex, 0);
      }
      break;
    }
    default: {
      assert( iType-2 >= 0 );
      assert( iType-2 < ArraySize(staticMutexes) );
      p = &staticMutexes[iType-2];
#if SQLITE_MUTEX_NREF
      p->id = iType;
#endif
      break;
    }
  }
  return p;
}